

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O0

logic * __thiscall sfi::logic::dotToDotDec(logic *this,string *str,int base)

{
  bool bVar1;
  istream *piVar2;
  __cxx11 local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  undefined4 local_210;
  exception e;
  long oct;
  allocator local_1e1;
  string local_1e0 [8];
  string result;
  string local_1c0 [8];
  string octet;
  istringstream local_1a0 [8];
  istringstream stream;
  int base_local;
  string *str_local;
  
  std::__cxx11::istringstream::istringstream(local_1a0,str,8);
  std::__cxx11::string::string(local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"",&local_1e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,local_1c0,'.');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    _e = std::__cxx11::stoul((string *)local_1c0,(size_t *)0x0,base);
    std::__cxx11::to_string(local_250,_e);
    std::operator+(local_230,(char *)local_250);
    std::__cxx11::string::operator+=(local_1e0,(string *)local_230);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::string::~string((string *)local_250);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)this,(ulong)local_1e0);
  local_210 = 1;
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return this;
}

Assistant:

static string sfi::logic::dotToDotDec(const string& str, int base){
    istringstream stream(str);
    string octet;
    string result{""};
    long oct;
    while(getline(stream,octet,'.')){
            try {
                oct = stoul(octet, nullptr, base);
            } catch (exception e){
                return "0";
            }
            result += to_string(oct) + ".";
    }
    return result.substr(0,result.length()-1);
}